

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

ComponentNameMap * __thiscall
libcellml::createComponentNamesMap_abi_cxx11_
          (ComponentNameMap *__return_storage_ptr__,libcellml *this,ComponentPtr *component)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  ComponentPtr *component_00;
  ComponentPtr *extraout_RDX;
  ulong uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_bool>
  pVar4;
  ComponentPtr c;
  ComponentNameMap childrenNameMap;
  NamedEntity *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar3 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  while( true ) {
    sVar2 = ComponentEntity::componentCount(*(ComponentEntity **)this);
    if (sVar2 <= uVar3) break;
    ComponentEntity::component((ComponentEntity *)&local_70,*(size_t *)this);
    NamedEntity::name_abi_cxx11_(&local_60,local_70);
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>>
            ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<libcellml::Component>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>>
                        *)__return_storage_ptr__,&local_60,
                       (shared_ptr<libcellml::Component> *)&local_70);
    component_00 = pVar4._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      component_00 = extraout_RDX;
    }
    createComponentNamesMap_abi_cxx11_
              ((ComponentNameMap *)&local_60,(libcellml *)&local_70,component_00);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>>
    ::
    _M_insert_range_unique<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<libcellml::Component>>>>
                *)__return_storage_ptr__,
               (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>
                )local_60.field_2._8_8_,
               (_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>
                )&local_60._M_string_length);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::Component>_>_>_>
                 *)&local_60);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    uVar3 = uVar3 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ComponentNameMap createComponentNamesMap(const ComponentPtr &component)
{
    ComponentNameMap nameMap;
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto c = component->component(index);
        nameMap.emplace(c->name(), c);
        ComponentNameMap childrenNameMap = createComponentNamesMap(c);
        nameMap.insert(childrenNameMap.begin(), childrenNameMap.end());
    }

    return nameMap;
}